

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddExecutableCommand.cxx
# Opt level: O0

bool __thiscall
cmAddExecutableCommand::InitialPass
          (cmAddExecutableCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  bool bVar1;
  TargetType TVar2;
  long lVar3;
  size_type sVar4;
  reference pbVar5;
  cmTarget *pcVar6;
  ostream *poVar7;
  byte local_bd9;
  allocator<char> local_bc1;
  string local_bc0;
  allocator<char> local_b99;
  string local_b98;
  cmTarget *local_b78;
  cmTarget *tgt;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b68;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b60;
  undefined1 local_b58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srclists;
  undefined1 local_b38 [8];
  string msg;
  ostringstream local_af8 [8];
  ostringstream e_5;
  string local_980;
  ostringstream local_960 [8];
  ostringstream e_4;
  string local_7e8;
  ostringstream local_7c8 [8];
  ostringstream e_3;
  undefined1 local_648 [4];
  TargetType type;
  ostringstream local_628 [8];
  ostringstream e_2;
  cmTarget *aliasedTarget;
  ostringstream local_488 [8];
  ostringstream e_1;
  string *aliasedName;
  ostringstream local_2e8 [8];
  ostringstream e;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  bool local_81;
  const_iterator cStack_80;
  bool nameOk;
  byte local_76;
  byte local_75;
  byte local_74;
  byte local_73;
  byte local_72;
  byte local_71;
  bool isAlias;
  bool importGlobal;
  bool importTarget;
  bool excludeFromAll;
  bool use_macbundle;
  reference pbStack_70;
  bool use_win32;
  string *exename;
  const_iterator s;
  allocator<char> local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmAddExecutableCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._7_1_ = 0;
  }
  else {
    exename = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)param_2_local);
    pbStack_70 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&exename);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&exename);
    local_71 = 0;
    local_72 = 0;
    local_73 = 0;
    local_74 = 0;
    local_75 = 0;
    local_76 = 0;
LAB_002acfe6:
    cStack_80 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)param_2_local);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&exename,&stack0xffffffffffffff80);
    if (bVar1) {
      pbVar5 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&exename);
      bVar1 = std::operator==(pbVar5,"WIN32");
      if (bVar1) {
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&exename);
        local_71 = 1;
      }
      else {
        pbVar5 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&exename);
        bVar1 = std::operator==(pbVar5,"MACOSX_BUNDLE");
        if (bVar1) {
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&exename);
          local_72 = 1;
        }
        else {
          pbVar5 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&exename);
          bVar1 = std::operator==(pbVar5,"EXCLUDE_FROM_ALL");
          if (bVar1) {
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&exename);
            local_73 = 1;
          }
          else {
            pbVar5 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&exename);
            bVar1 = std::operator==(pbVar5,"IMPORTED");
            if (bVar1) {
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&exename);
              local_74 = 1;
            }
            else {
              if ((local_74 & 1) != 0) {
                pbVar5 = __gnu_cxx::
                         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&exename);
                bVar1 = std::operator==(pbVar5,"GLOBAL");
                if (bVar1) {
                  __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&exename);
                  local_75 = 1;
                  goto LAB_002acfe6;
                }
              }
              pbVar5 = __gnu_cxx::
                       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&exename);
              bVar1 = std::operator==(pbVar5,"ALIAS");
              if (!bVar1) goto LAB_002ad137;
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&exename);
              local_76 = 1;
            }
          }
        }
      }
      goto LAB_002acfe6;
    }
LAB_002ad137:
    bVar1 = cmGeneratorExpression::IsValidTargetName(pbStack_70);
    local_bd9 = 0;
    if (bVar1) {
      bVar1 = cmGlobalGenerator::IsReservedTarget(pbStack_70);
      local_bd9 = bVar1 ^ 0xff;
    }
    local_81 = (bool)(local_bd9 & 1);
    if (((local_81 != false) && ((local_74 & 1) == 0)) && ((local_76 & 1) == 0)) {
      lVar3 = std::__cxx11::string::find((char)pbStack_70,0x3a);
      local_81 = lVar3 == -1;
    }
    if ((local_81 != false) ||
       (bVar1 = cmMakefile::CheckCMP0037((this->super_cmCommand).Makefile,pbStack_70,EXECUTABLE),
       bVar1)) {
      if (((local_74 & 1) == 0) ||
         ((((local_71 & 1) == 0 && ((local_72 & 1) == 0)) && ((local_73 & 1) == 0)))) {
        if ((local_76 & 1) == 0) {
          if ((local_74 & 1) == 0) {
            std::__cxx11::string::string((string *)local_b38);
            bVar1 = cmMakefile::EnforceUniqueName
                              ((this->super_cmCommand).Makefile,pbStack_70,(string *)local_b38,false
                              );
            if (!bVar1) {
              cmCommand::SetError(&this->super_cmCommand,(string *)local_b38);
              this_local._7_1_ = 0;
            }
            srclists.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
            srclists.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
            std::__cxx11::string::~string((string *)local_b38);
            if (srclists.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
              local_b60._M_current = exename;
              local_b68._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)param_2_local);
              std::
              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)((long)&tgt + 7));
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         local_b58,local_b60,local_b68,
                         (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)((long)&tgt + 7));
              std::
              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)((long)&tgt + 7));
              pcVar6 = cmMakefile::AddExecutable
                                 ((this->super_cmCommand).Makefile,pbStack_70,
                                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_b58,(bool)(local_73 & 1));
              local_b78 = pcVar6;
              if ((local_71 & 1) != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_b98,"WIN32_EXECUTABLE",&local_b99);
                cmTarget::SetProperty(pcVar6,&local_b98,"ON");
                std::__cxx11::string::~string((string *)&local_b98);
                std::allocator<char>::~allocator(&local_b99);
              }
              pcVar6 = local_b78;
              if ((local_72 & 1) != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_bc0,"MACOSX_BUNDLE",&local_bc1);
                cmTarget::SetProperty(pcVar6,&local_bc0,"ON");
                std::__cxx11::string::~string((string *)&local_bc0);
                std::allocator<char>::~allocator(&local_bc1);
              }
              this_local._7_1_ = 1;
              srclists.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_b58);
            }
          }
          else {
            pcVar6 = cmMakefile::FindTargetToUse((this->super_cmCommand).Makefile,pbStack_70,false);
            if (pcVar6 == (cmTarget *)0x0) {
              cmMakefile::AddImportedTarget
                        ((this->super_cmCommand).Makefile,pbStack_70,EXECUTABLE,(bool)(local_75 & 1)
                        );
              this_local._7_1_ = 1;
            }
            else {
              std::__cxx11::ostringstream::ostringstream(local_af8);
              poVar7 = std::operator<<((ostream *)local_af8,"cannot create imported target \"");
              poVar7 = std::operator<<(poVar7,(string *)pbStack_70);
              std::operator<<(poVar7,"\" because another target with the same name already exists.")
              ;
              std::__cxx11::ostringstream::str();
              cmCommand::SetError(&this->super_cmCommand,(string *)((long)&msg.field_2 + 8));
              std::__cxx11::string::~string((string *)(msg.field_2._M_local_buf + 8));
              this_local._7_1_ = 0;
              std::__cxx11::ostringstream::~ostringstream(local_af8);
            }
          }
        }
        else {
          bVar1 = cmGeneratorExpression::IsValidTargetName(pbStack_70);
          if (bVar1) {
            if ((local_73 & 1) == 0) {
              if (((local_74 & 1) == 0) && ((local_75 & 1) == 0)) {
                sVar4 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)param_2_local);
                if (sVar4 == 3) {
                  pbVar5 = __gnu_cxx::
                           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)&exename);
                  bVar1 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,pbVar5);
                  if (bVar1) {
                    std::__cxx11::ostringstream::ostringstream(local_488);
                    poVar7 = std::operator<<((ostream *)local_488,"cannot create ALIAS target \"");
                    poVar7 = std::operator<<(poVar7,(string *)pbStack_70);
                    poVar7 = std::operator<<(poVar7,"\" because target \"");
                    poVar7 = std::operator<<(poVar7,(string *)pbVar5);
                    std::operator<<(poVar7,"\" is itself an ALIAS.");
                    std::__cxx11::ostringstream::str();
                    cmCommand::SetError(&this->super_cmCommand,(string *)&aliasedTarget);
                    std::__cxx11::string::~string((string *)&aliasedTarget);
                    this_local._7_1_ = 0;
                    std::__cxx11::ostringstream::~ostringstream(local_488);
                  }
                  else {
                    pcVar6 = cmMakefile::FindTargetToUse
                                       ((this->super_cmCommand).Makefile,pbVar5,true);
                    if (pcVar6 == (cmTarget *)0x0) {
                      std::__cxx11::ostringstream::ostringstream(local_628);
                      poVar7 = std::operator<<((ostream *)local_628,"cannot create ALIAS target \"")
                      ;
                      poVar7 = std::operator<<(poVar7,(string *)pbStack_70);
                      poVar7 = std::operator<<(poVar7,"\" because target \"");
                      poVar7 = std::operator<<(poVar7,(string *)pbVar5);
                      std::operator<<(poVar7,"\" does not already exist.");
                      std::__cxx11::ostringstream::str();
                      cmCommand::SetError(&this->super_cmCommand,(string *)local_648);
                      std::__cxx11::string::~string((string *)local_648);
                      this_local._7_1_ = 0;
                      std::__cxx11::ostringstream::~ostringstream(local_628);
                    }
                    else {
                      TVar2 = cmTarget::GetType(pcVar6);
                      if (TVar2 == EXECUTABLE) {
                        bVar1 = cmTarget::IsImported(pcVar6);
                        if ((!bVar1) || (bVar1 = cmTarget::IsImportedGloballyVisible(pcVar6), bVar1)
                           ) {
                          cmMakefile::AddAlias((this->super_cmCommand).Makefile,pbStack_70,pbVar5);
                          this_local._7_1_ = 1;
                        }
                        else {
                          std::__cxx11::ostringstream::ostringstream(local_960);
                          poVar7 = std::operator<<((ostream *)local_960,
                                                   "cannot create ALIAS target \"");
                          poVar7 = std::operator<<(poVar7,(string *)pbStack_70);
                          poVar7 = std::operator<<(poVar7,"\" because target \"");
                          poVar7 = std::operator<<(poVar7,(string *)pbVar5);
                          std::operator<<(poVar7,"\" is imported but not globally visible.");
                          std::__cxx11::ostringstream::str();
                          cmCommand::SetError(&this->super_cmCommand,&local_980);
                          std::__cxx11::string::~string((string *)&local_980);
                          this_local._7_1_ = 0;
                          std::__cxx11::ostringstream::~ostringstream(local_960);
                        }
                      }
                      else {
                        std::__cxx11::ostringstream::ostringstream(local_7c8);
                        poVar7 = std::operator<<((ostream *)local_7c8,
                                                 "cannot create ALIAS target \"");
                        poVar7 = std::operator<<(poVar7,(string *)pbStack_70);
                        poVar7 = std::operator<<(poVar7,"\" because target \"");
                        poVar7 = std::operator<<(poVar7,(string *)pbVar5);
                        std::operator<<(poVar7,"\" is not an executable.");
                        std::__cxx11::ostringstream::str();
                        cmCommand::SetError(&this->super_cmCommand,&local_7e8);
                        std::__cxx11::string::~string((string *)&local_7e8);
                        this_local._7_1_ = 0;
                        std::__cxx11::ostringstream::~ostringstream(local_7c8);
                      }
                    }
                  }
                }
                else {
                  std::__cxx11::ostringstream::ostringstream(local_2e8);
                  std::operator<<((ostream *)local_2e8,"ALIAS requires exactly one target argument."
                                 );
                  std::__cxx11::ostringstream::str();
                  cmCommand::SetError(&this->super_cmCommand,(string *)&aliasedName);
                  std::__cxx11::string::~string((string *)&aliasedName);
                  this_local._7_1_ = 0;
                  std::__cxx11::ostringstream::~ostringstream(local_2e8);
                }
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_168,"IMPORTED with ALIAS is not allowed.",&local_169);
                cmCommand::SetError(&this->super_cmCommand,&local_168);
                std::__cxx11::string::~string((string *)&local_168);
                std::allocator<char>::~allocator(&local_169);
                this_local._7_1_ = 0;
              }
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_140,"EXCLUDE_FROM_ALL with ALIAS makes no sense.",
                         &local_141);
              cmCommand::SetError(&this->super_cmCommand,&local_140);
              std::__cxx11::string::~string((string *)&local_140);
              std::allocator<char>::~allocator(&local_141);
              this_local._7_1_ = 0;
            }
          }
          else {
            std::operator+(&local_120,"Invalid name for ALIAS: ",pbStack_70);
            cmCommand::SetError(&this->super_cmCommand,&local_120);
            std::__cxx11::string::~string((string *)&local_120);
            this_local._7_1_ = 0;
          }
        }
      }
      else {
        if ((local_71 & 1) == 0) {
          if ((local_72 & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_f8,
                       "may not be given EXCLUDE_FROM_ALL for an IMPORTED target.",&local_f9);
            cmCommand::SetError(&this->super_cmCommand,&local_f8);
            std::__cxx11::string::~string((string *)&local_f8);
            std::allocator<char>::~allocator(&local_f9);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_d0,"may not be given MACOSX_BUNDLE for an IMPORTED target.",
                       &local_d1);
            cmCommand::SetError(&this->super_cmCommand,&local_d0);
            std::__cxx11::string::~string((string *)&local_d0);
            std::allocator<char>::~allocator(&local_d1);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a8,"may not be given WIN32 for an IMPORTED target.",&local_a9)
          ;
          cmCommand::SetError(&this->super_cmCommand,&local_a8);
          std::__cxx11::string::~string((string *)&local_a8);
          std::allocator<char>::~allocator(&local_a9);
        }
        this_local._7_1_ = 0;
      }
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmAddExecutableCommand::InitialPass(std::vector<std::string> const& args,
                                         cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::vector<std::string>::const_iterator s = args.begin();

  std::string const& exename = *s;

  ++s;
  bool use_win32 = false;
  bool use_macbundle = false;
  bool excludeFromAll = false;
  bool importTarget = false;
  bool importGlobal = false;
  bool isAlias = false;
  while (s != args.end()) {
    if (*s == "WIN32") {
      ++s;
      use_win32 = true;
    } else if (*s == "MACOSX_BUNDLE") {
      ++s;
      use_macbundle = true;
    } else if (*s == "EXCLUDE_FROM_ALL") {
      ++s;
      excludeFromAll = true;
    } else if (*s == "IMPORTED") {
      ++s;
      importTarget = true;
    } else if (importTarget && *s == "GLOBAL") {
      ++s;
      importGlobal = true;
    } else if (*s == "ALIAS") {
      ++s;
      isAlias = true;
    } else {
      break;
    }
  }

  bool nameOk = cmGeneratorExpression::IsValidTargetName(exename) &&
    !cmGlobalGenerator::IsReservedTarget(exename);

  if (nameOk && !importTarget && !isAlias) {
    nameOk = exename.find(':') == std::string::npos;
  }
  if (!nameOk &&
      !this->Makefile->CheckCMP0037(exename, cmStateEnums::EXECUTABLE)) {
    return false;
  }

  // Special modifiers are not allowed with IMPORTED signature.
  if (importTarget && (use_win32 || use_macbundle || excludeFromAll)) {
    if (use_win32) {
      this->SetError("may not be given WIN32 for an IMPORTED target.");
    } else if (use_macbundle) {
      this->SetError("may not be given MACOSX_BUNDLE for an IMPORTED target.");
    } else // if(excludeFromAll)
    {
      this->SetError(
        "may not be given EXCLUDE_FROM_ALL for an IMPORTED target.");
    }
    return false;
  }
  if (isAlias) {
    if (!cmGeneratorExpression::IsValidTargetName(exename)) {
      this->SetError("Invalid name for ALIAS: " + exename);
      return false;
    }
    if (excludeFromAll) {
      this->SetError("EXCLUDE_FROM_ALL with ALIAS makes no sense.");
      return false;
    }
    if (importTarget || importGlobal) {
      this->SetError("IMPORTED with ALIAS is not allowed.");
      return false;
    }
    if (args.size() != 3) {
      std::ostringstream e;
      e << "ALIAS requires exactly one target argument.";
      this->SetError(e.str());
      return false;
    }

    std::string const& aliasedName = *s;
    if (this->Makefile->IsAlias(aliasedName)) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename << "\" because target \""
        << aliasedName << "\" is itself an ALIAS.";
      this->SetError(e.str());
      return false;
    }
    cmTarget* aliasedTarget =
      this->Makefile->FindTargetToUse(aliasedName, true);
    if (!aliasedTarget) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename << "\" because target \""
        << aliasedName << "\" does not already exist.";
      this->SetError(e.str());
      return false;
    }
    cmStateEnums::TargetType type = aliasedTarget->GetType();
    if (type != cmStateEnums::EXECUTABLE) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename << "\" because target \""
        << aliasedName << "\" is not an executable.";
      this->SetError(e.str());
      return false;
    }
    if (aliasedTarget->IsImported() &&
        !aliasedTarget->IsImportedGloballyVisible()) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename << "\" because target \""
        << aliasedName << "\" is imported but not globally visible.";
      this->SetError(e.str());
      return false;
    }
    this->Makefile->AddAlias(exename, aliasedName);
    return true;
  }

  // Handle imported target creation.
  if (importTarget) {
    // Make sure the target does not already exist.
    if (this->Makefile->FindTargetToUse(exename)) {
      std::ostringstream e;
      e << "cannot create imported target \"" << exename
        << "\" because another target with the same name already exists.";
      this->SetError(e.str());
      return false;
    }

    // Create the imported target.
    this->Makefile->AddImportedTarget(exename, cmStateEnums::EXECUTABLE,
                                      importGlobal);
    return true;
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!this->Makefile->EnforceUniqueName(exename, msg)) {
      this->SetError(msg);
      return false;
    }
  }

  std::vector<std::string> srclists(s, args.end());
  cmTarget* tgt =
    this->Makefile->AddExecutable(exename, srclists, excludeFromAll);
  if (use_win32) {
    tgt->SetProperty("WIN32_EXECUTABLE", "ON");
  }
  if (use_macbundle) {
    tgt->SetProperty("MACOSX_BUNDLE", "ON");
  }

  return true;
}